

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checking.cc
# Opt level: O0

void __thiscall
dtc::fdt::checking::check_manager::add_property_size_checker
          (check_manager *this,char *name,string *prop,uint32_t size)

{
  property_size_checker *this_00;
  property_size_checker *local_90 [3];
  allocator<char> local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::property_size_checker_*>
  local_50;
  uint32_t local_24;
  string *psStack_20;
  uint32_t size_local;
  string *prop_local;
  char *name_local;
  check_manager *this_local;
  
  local_24 = size;
  psStack_20 = prop;
  prop_local = (string *)name;
  name_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,name,&local_71);
  this_00 = (property_size_checker *)operator_new(0x50);
  property_size_checker::property_size_checker(this_00,(char *)prop_local,psStack_20,local_24);
  local_90[0] = this_00;
  std::make_pair<std::__cxx11::string,dtc::fdt::checking::property_size_checker*>
            (&local_50,&local_70,local_90);
  std::
  unordered_map<std::__cxx11::string,dtc::fdt::checking::checker*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,dtc::fdt::checking::checker*>>>
  ::insert<std::pair<std::__cxx11::string,dtc::fdt::checking::property_size_checker*>>
            ((unordered_map<std::__cxx11::string,dtc::fdt::checking::checker*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,dtc::fdt::checking::checker*>>>
              *)this,&local_50);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::property_size_checker_*>
  ::~pair(&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  return;
}

Assistant:

void
check_manager::add_property_size_checker(const char *name,
                                         const string &prop,
                                         uint32_t size)
{
	checkers.insert(std::make_pair(string(name),
		new property_size_checker(name, prop, size)));
}